

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunmatrix_dense.c
# Opt level: O0

SUNErrCode SUNMatScaleAddI_Dense(sunrealtype c,SUNMatrix A)

{
  long lVar1;
  sunindextype j;
  sunindextype i;
  SUNContext_conflict sunctx_local_scope_;
  SUNMatrix A_local;
  sunrealtype c_local;
  
  for (j = 0; j < *(long *)((long)A->content + 8); j = j + 1) {
    for (i = 0; i < *A->content; i = i + 1) {
      lVar1 = *(long *)(*(long *)((long)A->content + 0x20) + j * 8);
      *(double *)(lVar1 + i * 8) = c * *(double *)(lVar1 + i * 8);
      if (i == j) {
        lVar1 = *(long *)(*(long *)((long)A->content + 0x20) + j * 8);
        *(double *)(lVar1 + i * 8) = *(double *)(lVar1 + i * 8) + 1.0;
      }
    }
  }
  return 0;
}

Assistant:

SUNErrCode SUNMatScaleAddI_Dense(sunrealtype c, SUNMatrix A)
{
  SUNFunctionBegin(A->sunctx);
  sunindextype i, j;

  SUNAssert(SUNMatGetID(A) == SUNMATRIX_DENSE, SUN_ERR_ARG_WRONGTYPE);

  /* Perform operation A = c*A + I */
  for (j = 0; j < SM_COLUMNS_D(A); j++)
  {
    for (i = 0; i < SM_ROWS_D(A); i++)
    {
      SM_ELEMENT_D(A, i, j) *= c;
      if (i == j) { SM_ELEMENT_D(A, i, j) += ONE; }
    }
  }

  return SUN_SUCCESS;
}